

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O3

int ffh_pairs(lua_State *L,MMS mm)

{
  int iVar1;
  TValue *o;
  cTValue *pcVar2;
  
  o = lj_lib_checkany(L,1);
  pcVar2 = lj_meta_lookup(L,o,mm);
  if ((o->field_2).it == 0xfffffff4) {
    o[-1].field_2.field_0 =
         *(anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0 *)
          ((ulong)L->base[-1].u32.lo + 0x20);
    *(undefined4 *)((long)o + -4) = 0xfffffff7;
    if (mm == MM_pairs) {
      *(undefined4 *)((long)o + 0xc) = 0xffffffff;
    }
    else {
      o[1].u64 = 0;
    }
    iVar1 = 4;
  }
  else {
    if (((o->field_2).it != 0xfffffff5) || ((pcVar2->field_2).it == 0xffffffff)) {
      lj_err_argt(L,1,5);
    }
    L->top = o + 1;
    L->base[-1] = *pcVar2;
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

static int ffh_pairs(lua_State *L, MMS mm)
{
  TValue *o = lj_lib_checkany(L, 1);
  cTValue *mo = lj_meta_lookup(L, o, mm);
  if ((LJ_52 || tviscdata(o)) && !tvisnil(mo)) {
    L->top = o+1;  /* Only keep one argument. */
    copyTV(L, L->base-1-LJ_FR2, mo);  /* Replace callable. */
    return FFH_TAILCALL;
  } else {
    if (!tvistab(o)) lj_err_argt(L, 1, LUA_TTABLE);
    if (LJ_FR2) { copyTV(L, o-1, o); o--; }
    setfuncV(L, o-1, funcV(lj_lib_upvalue(L, 1)));
    if (mm == MM_pairs) setnilV(o+1); else setintV(o+1, 0);
    return FFH_RES(3);
  }
}